

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa_util.cpp
# Opt level: O2

Instruction * spvtools::opt::anon_unknown_0::GetVariableType(IRContext *context,Instruction *var)

{
  uint32_t uVar1;
  DefUseManager *pDVar2;
  Instruction *pIVar3;
  
  if (var->opcode_ == OpVariable) {
    uVar1 = Instruction::type_id(var);
    pDVar2 = IRContext::get_def_use_mgr(context);
    pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
    if (pIVar3->opcode_ == OpTypePointer) {
      uVar1 = Instruction::GetSingleWordInOperand(pIVar3,1);
      pDVar2 = IRContext::get_def_use_mgr(context);
      pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
      return pIVar3;
    }
  }
  return (Instruction *)0x0;
}

Assistant:

Instruction* GetVariableType(IRContext* context, Instruction* var) {
  if (var->opcode() != spv::Op::OpVariable) {
    return nullptr;
  }

  uint32_t ptr_type_id = var->type_id();
  Instruction* ptr_type_inst = context->get_def_use_mgr()->GetDef(ptr_type_id);
  if (ptr_type_inst->opcode() != spv::Op::OpTypePointer) {
    return nullptr;
  }

  uint32_t var_type_id = ptr_type_inst->GetSingleWordInOperand(1);
  return context->get_def_use_mgr()->GetDef(var_type_id);
}